

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

void ssl_write_renegotiation_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t *olen)

{
  size_t sVar1;
  uchar *__dest;
  uchar *local_28;
  uchar *p;
  size_t *olen_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->secure_renegotiation == 1) {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x7c3,"server hello, secure renegotiation extension");
    *buf = 0xff;
    buf[1] = '\x01';
    if (ssl->renego_status == 0) {
      buf[2] = '\0';
      buf[3] = '\x01';
      local_28 = buf + 5;
      buf[4] = '\0';
    }
    else {
      buf[2] = '\0';
      buf[3] = (char)ssl->verify_data_len * '\x02' + '\x01';
      __dest = buf + 5;
      buf[4] = (uchar)((ssl->verify_data_len & 0x7f) << 1);
      memcpy(__dest,ssl->peer_verify_data,ssl->verify_data_len);
      sVar1 = ssl->verify_data_len;
      memcpy(__dest + sVar1,ssl->own_verify_data,ssl->verify_data_len);
      local_28 = __dest + sVar1 + ssl->verify_data_len;
    }
    *olen = (long)local_28 - (long)buf;
  }
  else {
    *olen = 0;
  }
  return;
}

Assistant:

static void ssl_write_renegotiation_ext( mbedtls_ssl_context *ssl,
                                         unsigned char *buf,
                                         size_t *olen )
{
    unsigned char *p = buf;

    if( ssl->secure_renegotiation != MBEDTLS_SSL_SECURE_RENEGOTIATION )
    {
        *olen = 0;
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, secure renegotiation extension" ) );

    *p++ = (unsigned char)( ( MBEDTLS_TLS_EXT_RENEGOTIATION_INFO >> 8 ) & 0xFF );
    *p++ = (unsigned char)( ( MBEDTLS_TLS_EXT_RENEGOTIATION_INFO      ) & 0xFF );

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if( ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE )
    {
        *p++ = 0x00;
        *p++ = ( ssl->verify_data_len * 2 + 1 ) & 0xFF;
        *p++ = ssl->verify_data_len * 2 & 0xFF;

        memcpy( p, ssl->peer_verify_data, ssl->verify_data_len );
        p += ssl->verify_data_len;
        memcpy( p, ssl->own_verify_data, ssl->verify_data_len );
        p += ssl->verify_data_len;
    }
    else
#endif /* MBEDTLS_SSL_RENEGOTIATION */
    {
        *p++ = 0x00;
        *p++ = 0x01;
        *p++ = 0x00;
    }

    *olen = p - buf;
}